

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O3

void __thiscall
MarkdownHighlighter::clearRangesForBlock(MarkdownHighlighter *this,int blockNumber,RangeType type)

{
  int iVar1;
  undefined4 uVar2;
  QList<MarkdownHighlighter::InlineRange> *this_00;
  iterator iVar3;
  iterator iVar4;
  InlineRange *pIVar5;
  long lVar6;
  long lVar7;
  iterator abegin;
  int local_5c;
  QList<MarkdownHighlighter::InlineRange> local_58;
  QList<MarkdownHighlighter::InlineRange> local_38;
  
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (InlineRange *)0x0;
  local_58.d.size = 0;
  local_5c = blockNumber;
  QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::value
            (&local_38,&this->_ranges,&local_5c,&local_58);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,0xc,8);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0xc,8);
    }
  }
  if (local_38.d.size == 0) {
    return;
  }
  QSyntaxHighlighter::currentBlock();
  uVar2 = QTextBlock::blockNumber();
  local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,uVar2);
  this_00 = QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::operator[]
                      (&this->_ranges,(int *)&local_58);
  iVar3 = QList<MarkdownHighlighter::InlineRange>::begin(this_00);
  iVar4 = QList<MarkdownHighlighter::InlineRange>::end(this_00);
  lVar7 = (long)iVar4.i - (long)iVar3.i;
  lVar6 = (lVar7 >> 2) * -0x5555555555555555 >> 2;
  if (0 < lVar6) {
    lVar7 = lVar6 + 1;
    abegin.i = iVar3.i + 2;
    do {
      if (abegin.i[-2].type == type) {
        abegin.i = abegin.i + -2;
        goto LAB_00127679;
      }
      if (abegin.i[-1].type == type) {
        abegin.i = abegin.i + -1;
        goto LAB_00127679;
      }
      if ((abegin.i)->type == type) goto LAB_00127679;
      if (abegin.i[1].type == type) {
        abegin.i = abegin.i + 1;
        goto LAB_00127679;
      }
      lVar7 = lVar7 + -1;
      abegin.i = abegin.i + 4;
    } while (1 < lVar7);
    lVar7 = (long)iVar4.i - (long)(iVar3.i + lVar6 * 4);
    iVar3.i = iVar3.i + lVar6 * 4;
  }
  lVar6 = (lVar7 >> 2) * -0x5555555555555555;
  if (lVar6 == 1) {
LAB_0012765d:
    abegin.i = iVar3.i;
    if ((iVar3.i)->type != type) {
      abegin = iVar4;
    }
  }
  else if (lVar6 == 2) {
LAB_00127654:
    abegin.i = iVar3.i;
    if ((iVar3.i)->type != type) {
      iVar3.i = iVar3.i + 1;
      goto LAB_0012765d;
    }
  }
  else {
    abegin = iVar4;
    if (lVar6 != 3) goto LAB_001276ae;
    abegin.i = iVar3.i;
    if ((iVar3.i)->type != type) {
      iVar3.i = iVar3.i + 1;
      goto LAB_00127654;
    }
  }
LAB_00127679:
  pIVar5 = abegin.i + 1;
  if (pIVar5 != iVar4.i && abegin.i != iVar4.i) {
    do {
      if (pIVar5->type != type) {
        (abegin.i)->type = pIVar5->type;
        iVar1 = pIVar5->end;
        (abegin.i)->begin = pIVar5->begin;
        (abegin.i)->end = iVar1;
        abegin.i = abegin.i + 1;
      }
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != iVar4.i);
  }
LAB_001276ae:
  iVar3 = QList<MarkdownHighlighter::InlineRange>::end(this_00);
  QList<MarkdownHighlighter::InlineRange>::erase
            (this_00,(const_iterator)abegin.i,(const_iterator)iVar3.i);
  return;
}

Assistant:

void MarkdownHighlighter::clearRangesForBlock(int blockNumber, RangeType type)
{
    if (!_ranges.value(blockNumber).isEmpty()) {
        auto& rangeList = _ranges[currentBlock().blockNumber()];
        rangeList.erase(std::remove_if(rangeList.begin(), rangeList.end(),
                                       [type](const InlineRange& range) {
           return range.type == type;
        }), rangeList.end());
    }
}